

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

ostream * nivalis::operator<<(ostream *os,ASTNode *node)

{
  uint uVar1;
  ostream *poVar2;
  
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  uVar1 = node->opcode;
  if (uVar1 == 1) {
    std::operator<<(os,"#");
    std::ostream::_M_insert<double>((node->field_1).val);
    uVar1 = node->opcode;
  }
  if ((uVar1 < 0x13) && ((0x6000cU >> (uVar1 & 0x1f) & 1) != 0)) {
    poVar2 = std::operator<<(os,"&");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Expr::ASTNode& node) {
    os << node.opcode;
    if (node.opcode == OpCode::val) os << "#" << node.val;
    if (OpCode::has_ref(node.opcode)) os << "&" << node.ref;
    return os;
}